

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O2

void __thiscall
Rml::DataViewAttribute::DataViewAttribute
          (DataViewAttribute *this,Element *element,String *override_attribute,int sort_offset)

{
  String local_40;
  
  ::std::__cxx11::string::string((string *)&local_40,(string *)override_attribute);
  DataViewCommon::DataViewCommon(&this->super_DataViewCommon,element,&local_40,sort_offset);
  ::std::__cxx11::string::~string((string *)&local_40);
  (this->super_DataViewCommon).super_DataView.super_Releasable._vptr_Releasable =
       (_func_int **)&PTR__DataViewCommon_00396638;
  return;
}

Assistant:

DataViewAttribute::DataViewAttribute(Element* element, String override_attribute, int sort_offset) :
	DataViewCommon(element, std::move(override_attribute), sort_offset)
{}